

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setDualColBounds(SPxSolverBase<double> *this)

{
  int iVar1;
  Status SVar2;
  double *pdVar3;
  double dVar4;
  long in_RDI;
  int i;
  Desc *ds;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  SPxLPBase<double> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  Status stat;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 local_14;
  
  SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  local_14 = 0;
  while( true ) {
    iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x28029e);
    if (iVar1 <= local_14) break;
    pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar4 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = dVar4;
    pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar4 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = dVar4;
    SPxBasisBase<double>::Desc::rowStatus
              ((Desc *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    clearDualBounds((SPxSolverBase<double> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (Status)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                    (double *)in_stack_ffffffffffffff90,
                    (double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while( true ) {
    iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x28039b);
    if (iVar1 <= local_14) break;
    pdVar3 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    in_stack_ffffffffffffff90 = (SPxLPBase<double> *)((ulong)*pdVar3 ^ 0x8000000000000000);
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = (double)in_stack_ffffffffffffff90;
    pdVar3 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar4 = -*pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = dVar4;
    SVar2 = SPxBasisBase<double>::Desc::colStatus
                      ((Desc *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    stat = (Status)((ulong)dVar4 >> 0x20);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    clearDualBounds((SPxSolverBase<double> *)CONCAT44(SVar2,in_stack_ffffffffffffffa0),stat,
                    (double *)in_stack_ffffffffffffff90,
                    (double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = *pdVar3 * -1.0;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = *pdVar3 * -1.0;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setDualColBounds()
{

   assert(rep() == COLUMN);

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   int i;

   for(i = 0; i < this->nRows(); ++i)
   {
      theURbound[i] = this->maxRowObj(i);
      theLRbound[i] = this->maxRowObj(i);

      clearDualBounds(ds.rowStatus(i), theURbound[i], theLRbound[i]);
   }

   for(i = 0; i < this->nCols(); ++i)
   {
      theUCbound[i] = -this->maxObj(i);
      theLCbound[i] = -this->maxObj(i);

      // exchanged ...                 due to definition of slacks!
      clearDualBounds(ds.colStatus(i), theLCbound[i], theUCbound[i]);

      theUCbound[i] *= -1.0;
      theLCbound[i] *= -1.0;
   }
}